

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<TPZTensor<TFad<6,_double>_>,_3> * __thiscall
TPZManVector<TPZTensor<TFad<6,_double>_>,_3>::operator=
          (TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *this,
          TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *copy)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong *puVar5;
  TPZTensor<TFad<6,_double>_> *pTVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  if (this != copy) {
    uVar1 = (copy->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements;
    lVar7 = (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc;
    if ((lVar7 < (long)uVar1) &&
       (pTVar6 = (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore,
       pTVar6 != this->fExtAlloc && pTVar6 != (TPZTensor<TFad<6,_double>_> *)0x0)) {
      dVar2 = pTVar6[-1].fData.fExtAlloc[5].dx_[5];
      if (dVar2 != 0.0) {
        lVar7 = (long)dVar2 * 0x1a8;
        do {
          TPZTensor<TFad<6,_double>_>::~TPZTensor
                    ((TPZTensor<TFad<6,_double>_> *)
                     ((long)pTVar6[-1].fData.fExtAlloc[0].dx_ + lVar7 + -0x38));
          lVar7 = lVar7 + -0x1a8;
        } while (lVar7 != 0);
      }
      operator_delete__(pTVar6[-1].fData.fExtAlloc[5].dx_ + 5,(long)dVar2 * 0x1a8 + 8);
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = (TPZTensor<TFad<6,_double>_> *)0x0
      ;
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
      lVar7 = 0;
    }
    if ((long)uVar1 < 4) {
      pTVar6 = (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore;
      if (pTVar6 != (TPZTensor<TFad<6,_double>_> *)0x0 && pTVar6 != this->fExtAlloc) {
        dVar2 = pTVar6[-1].fData.fExtAlloc[5].dx_[5];
        if (dVar2 != 0.0) {
          lVar7 = (long)dVar2 * 0x1a8;
          do {
            TPZTensor<TFad<6,_double>_>::~TPZTensor
                      ((TPZTensor<TFad<6,_double>_> *)
                       ((long)pTVar6[-1].fData.fExtAlloc[0].dx_ + lVar7 + -0x38));
            lVar7 = lVar7 + -0x1a8;
          } while (lVar7 != 0);
        }
        operator_delete__(pTVar6[-1].fData.fExtAlloc[5].dx_ + 5,(long)dVar2 * 0x1a8 + 8);
      }
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = this->fExtAlloc;
    }
    else if (lVar7 < (long)uVar1) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar1;
      uVar4 = SUB168(auVar3 * ZEXT816(0x1a8),0);
      uVar8 = uVar4 + 8;
      if (0xfffffffffffffff7 < uVar4) {
        uVar8 = 0xffffffffffffffff;
      }
      if (SUB168(auVar3 * ZEXT816(0x1a8),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      puVar5 = (ulong *)operator_new__(uVar8);
      *puVar5 = uVar1;
      lVar7 = 0;
      pTVar6 = (TPZTensor<TFad<6,_double>_> *)(puVar5 + 1);
      do {
        TPZTensor<TFad<6,_double>_>::TPZTensor(pTVar6);
        lVar7 = lVar7 + -0x1a8;
        pTVar6 = pTVar6 + 1;
      } while (uVar1 * -0x1a8 - lVar7 != 0);
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore =
           (TPZTensor<TFad<6,_double>_> *)(puVar5 + 1);
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = uVar1;
    }
    (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = uVar1;
    uVar8 = 0;
    if (0 < (long)uVar1) {
      uVar8 = uVar1;
    }
    lVar7 = 8;
    while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
      TPZManVector<TFad<6,_double>,_6>::operator=
                ((TPZManVector<TFad<6,_double>,_6> *)
                 ((long)(((this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore)->fData).
                        fExtAlloc[0].dx_ + lVar7 + -0x38),
                 (TPZManVector<TFad<6,_double>,_6> *)
                 ((long)(((copy->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore)->fData).
                        fExtAlloc[0].dx_ + lVar7 + -0x38));
      lVar7 = lVar7 + 0x1a8;
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}